

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_get.c
# Opt level: O1

void * linkedlist_get(s_linkedlist *linked_list,uint index)

{
  s_linkedlist_node *psVar1;
  int iVar2;
  
  psVar1 = linked_list->head;
  if (psVar1 == (s_linkedlist_node *)0x0) {
    return (void *)0x0;
  }
  iVar2 = index + 1;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return psVar1->element;
    }
    psVar1 = psVar1->next;
  } while (psVar1 != (s_linkedlist_node *)0x0);
  return (void *)0x0;
}

Assistant:

void *linkedlist_get(s_linkedlist *linked_list, unsigned int index) {
    s_linkedlist_node *node = linked_list->head;

    while (node != NULL) {
        if (index == 0) {
            return (node->element);
        }

        index -= 1;
        node = node->next;
    }

    return (NULL);
}